

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yin_print_deviation(lyout *out,int level,lys_module *module,lys_deviation *deviation)

{
  char *attr_value;
  bool bVar1;
  char *str;
  int content;
  int p;
  int j;
  int i;
  lys_deviation *deviation_local;
  lys_module *module_local;
  lyout *plStack_10;
  int level_local;
  lyout *out_local;
  
  _j = deviation;
  deviation_local = (lys_deviation *)module;
  module_local._4_4_ = level;
  plStack_10 = out;
  attr_value = transform_json2schema(module,deviation->target_name);
  yin_print_open(plStack_10,module_local._4_4_,(char *)0x0,"deviation","target-node",attr_value,1);
  lydict_remove((ly_ctx *)deviation_local->target_name,attr_value);
  module_local._4_4_ = module_local._4_4_ + 1;
  if (_j->ext_size != '\0') {
    yin_print_extension_instances
              (plStack_10,module_local._4_4_,(lys_module *)deviation_local,LYEXT_SUBSTMT_SELF,'\0',
               _j->ext,(uint)_j->ext_size);
  }
  yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_DESCRIPTION,'\0',_j->dsc,
                    (lys_module *)deviation_local,_j->ext,(uint)_j->ext_size);
  yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_REFERENCE,'\0',_j->ref,
                    (lys_module *)deviation_local,_j->ext,(uint)_j->ext_size);
  p = 0;
  do {
    if ((int)(uint)_j->deviate_size <= p) {
      module_local._4_4_ = module_local._4_4_ + -1;
      yin_print_close(plStack_10,module_local._4_4_,(char *)0x0,"deviation",1);
      return;
    }
    ly_print(plStack_10,"%*s<deviate value=",(ulong)(uint)(module_local._4_4_ << 1),"");
    if (_j->deviate[p].mod == LY_DEVIATE_NO) {
      if (_j->deviate[p].ext_size != '\0') {
        ly_print(plStack_10,"\"not-supported\">\n");
        goto LAB_001b49df;
      }
      ly_print(plStack_10,"\"not-supported\"/>\n");
    }
    else {
      if (_j->deviate[p].mod == LY_DEVIATE_ADD) {
        ly_print(plStack_10,"\"add\">\n");
      }
      else if (_j->deviate[p].mod == LY_DEVIATE_RPL) {
        ly_print(plStack_10,"\"replace\">\n");
      }
      else if (_j->deviate[p].mod == LY_DEVIATE_DEL) {
        ly_print(plStack_10,"\"delete\">\n");
      }
LAB_001b49df:
      module_local._4_4_ = module_local._4_4_ + 1;
      if (_j->deviate[p].ext_size != '\0') {
        yin_print_extension_instances
                  (plStack_10,module_local._4_4_,(lys_module *)deviation_local,LYEXT_SUBSTMT_SELF,
                   '\0',_j->deviate[p].ext,(uint)_j->deviate[p].ext_size);
      }
      if (_j->deviate[p].type != (lys_type *)0x0) {
        yin_print_type(plStack_10,module_local._4_4_,(lys_module *)deviation_local,
                       _j->deviate[p].type);
      }
      yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_UNITS,'\0',_j->deviate[p].units,
                        (lys_module *)deviation_local,_j->deviate[p].ext,
                        (uint)_j->deviate[p].ext_size);
      for (content = 0; content < (int)(uint)_j->deviate[p].must_size; content = content + 1) {
        yin_print_must(plStack_10,module_local._4_4_,(lys_module *)deviation_local,
                       _j->deviate[p].must + content);
      }
      for (content = 0; content < (int)(uint)_j->deviate[p].unique_size; content = content + 1) {
        yin_print_unique(plStack_10,module_local._4_4_,_j->deviate[p].unique + content);
        str._0_4_ = 0;
        str._4_4_ = -1;
        do {
          str._4_4_ = lys_ext_iter(_j->deviate[p].ext,_j->deviate[p].ext_size,
                                   (char)str._4_4_ + '\x01',LYEXT_SUBSTMT_UNIQUE);
          bVar1 = false;
          if (str._4_4_ != -1) {
            bVar1 = (uint)_j->deviate[p].ext[str._4_4_]->insubstmt_index != content;
          }
        } while (bVar1);
        if (str._4_4_ != -1) {
          yin_print_close_parent(plStack_10,(int *)&str);
          do {
            yin_print_extension_instances
                      (plStack_10,module_local._4_4_ + 1,(lys_module *)deviation_local,
                       LYEXT_SUBSTMT_UNIQUE,(uint8_t)content,_j->deviate[p].ext + str._4_4_,1);
            do {
              str._4_4_ = lys_ext_iter(_j->deviate[p].ext,_j->deviate[p].ext_size,
                                       (char)str._4_4_ + '\x01',LYEXT_SUBSTMT_UNIQUE);
              bVar1 = false;
              if (str._4_4_ != -1) {
                bVar1 = (uint)_j->deviate[p].ext[str._4_4_]->insubstmt_index != content;
              }
            } while (bVar1);
          } while (str._4_4_ != -1);
          str._4_4_ = -1;
        }
        yin_print_close(plStack_10,module_local._4_4_,(char *)0x0,"unique",(int)str);
      }
      for (content = 0; content < (int)(uint)_j->deviate[p].dflt_size; content = content + 1) {
        yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_DEFAULT,(uint8_t)content,
                          _j->deviate[p].dflt[content],(lys_module *)deviation_local,
                          _j->deviate[p].ext,(uint)_j->deviate[p].ext_size);
      }
      if ((_j->deviate[p].flags & 1) == 0) {
        if ((_j->deviate[p].flags & 2) != 0) {
          yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_CONFIG,'\0',"false",
                            (lys_module *)deviation_local,_j->deviate->ext,
                            (uint)_j->deviate[p].ext_size);
        }
      }
      else {
        yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_CONFIG,'\0',"true",
                          (lys_module *)deviation_local,_j->deviate->ext,
                          (uint)_j->deviate[p].ext_size);
      }
      if ((_j->deviate[p].flags & 0x40) == 0) {
        if ((_j->deviate[p].flags & 0x80) != 0) {
          yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_MANDATORY,'\0',"false",
                            (lys_module *)deviation_local,_j->deviate[p].ext,
                            (uint)_j->deviate[p].ext_size);
        }
      }
      else {
        yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_MANDATORY,'\0',"true",
                          (lys_module *)deviation_local,_j->deviate[p].ext,
                          (uint)_j->deviate[p].ext_size);
      }
      if (_j->deviate[p].min_set != '\0') {
        yin_print_unsigned(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_MIN,'\0',
                           (lys_module *)deviation_local,_j->deviate[p].ext,
                           (uint)_j->deviate[p].ext_size,_j->deviate[p].min);
      }
      if (_j->deviate[p].max_set != '\0') {
        if (_j->deviate[p].max == 0) {
          yin_print_substmt(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_MAX,'\0',"unbounded",
                            (lys_module *)deviation_local,_j->deviate[p].ext,
                            (uint)_j->deviate[p].ext_size);
        }
        else {
          yin_print_unsigned(plStack_10,module_local._4_4_,LYEXT_SUBSTMT_MAX,'\0',
                             (lys_module *)deviation_local,_j->deviate[p].ext,
                             (uint)_j->deviate[p].ext_size,_j->deviate[p].max);
        }
      }
      module_local._4_4_ = module_local._4_4_ + -1;
      yin_print_close(plStack_10,module_local._4_4_,(char *)0x0,"deviate",1);
    }
    p = p + 1;
  } while( true );
}

Assistant:

static void
yin_print_deviation(struct lyout *out, int level, const struct lys_module *module,
                    const struct lys_deviation *deviation)
{
    int i, j, p, content;
    const char *str;

    str = transform_json2schema(module, deviation->target_name);
    yin_print_open(out, level, NULL, "deviation", "target-node", str, 1);
    lydict_remove(module->ctx, str);

    level++;

    if (deviation->ext_size) {
        yin_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0, deviation->ext, deviation->ext_size);
    }
    yin_print_substmt(out, level, LYEXT_SUBSTMT_DESCRIPTION, 0, deviation->dsc,
                      module, deviation->ext, deviation->ext_size);
    yin_print_substmt(out, level, LYEXT_SUBSTMT_REFERENCE, 0, deviation->ref,
                      module, deviation->ext, deviation->ext_size);

    for (i = 0; i < deviation->deviate_size; ++i) {
        ly_print(out, "%*s<deviate value=", LEVEL, INDENT);
        if (deviation->deviate[i].mod == LY_DEVIATE_NO) {
            if (deviation->deviate[i].ext_size) {
                ly_print(out, "\"not-supported\">\n");
            } else {
                ly_print(out, "\"not-supported\"/>\n");
                continue;
            }
        } else if (deviation->deviate[i].mod == LY_DEVIATE_ADD) {
            ly_print(out, "\"add\">\n");
        } else if (deviation->deviate[i].mod == LY_DEVIATE_RPL) {
            ly_print(out, "\"replace\">\n");
        } else if (deviation->deviate[i].mod == LY_DEVIATE_DEL) {
            ly_print(out, "\"delete\">\n");
        }
        level++;

        /* extensions */
        if (deviation->deviate[i].ext_size) {
            yin_print_extension_instances(out, level, module, LYEXT_SUBSTMT_SELF, 0,
                                          deviation->deviate[i].ext, deviation->deviate[i].ext_size);
        }

        /* type */
        if (deviation->deviate[i].type) {
            yin_print_type(out, level, module, deviation->deviate[i].type);
        }

        /* units */
        yin_print_substmt(out, level, LYEXT_SUBSTMT_UNITS, 0, deviation->deviate[i].units, module,
                          deviation->deviate[i].ext, deviation->deviate[i].ext_size);

        /* must */
        for (j = 0; j < deviation->deviate[i].must_size; ++j) {
            yin_print_must(out, level, module, &deviation->deviate[i].must[j]);
        }

        /* unique */
        for (j = 0; j < deviation->deviate[i].unique_size; ++j) {
            yin_print_unique(out, level, &deviation->deviate[i].unique[j]);
            content = 0;
            /* unique's extensions */
            p = -1;
            do {
                p = lys_ext_iter(deviation->deviate[i].ext, deviation->deviate[i].ext_size,
                                      p + 1, LYEXT_SUBSTMT_UNIQUE);
            } while (p != -1 && deviation->deviate[i].ext[p]->insubstmt_index != j);
            if (p != -1) {
                yin_print_close_parent(out, &content);
                do {
                    yin_print_extension_instances(out, level + 1, module, LYEXT_SUBSTMT_UNIQUE, j,
                                                  &deviation->deviate[i].ext[p], 1);
                    do {
                        p = lys_ext_iter(deviation->deviate[i].ext, deviation->deviate[i].ext_size,
                                              p + 1, LYEXT_SUBSTMT_UNIQUE);
                    } while (p != -1 && deviation->deviate[i].ext[p]->insubstmt_index != j);
                } while (p != -1);
            }
            yin_print_close(out, level, NULL, "unique", content);
        }

        /* default */
        for (j = 0; j < deviation->deviate[i].dflt_size; ++j) {
            yin_print_substmt(out, level, LYEXT_SUBSTMT_DEFAULT, j, deviation->deviate[i].dflt[j], module,
                              deviation->deviate[i].ext, deviation->deviate[i].ext_size);
        }

        /* config */
        if (deviation->deviate[i].flags & LYS_CONFIG_W) {
            yin_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "true", module,
                              deviation->deviate->ext, deviation->deviate[i].ext_size);
        } else if (deviation->deviate[i].flags & LYS_CONFIG_R) {
            yin_print_substmt(out, level, LYEXT_SUBSTMT_CONFIG, 0, "false", module,
                               deviation->deviate->ext, deviation->deviate[i].ext_size);
        }

        /* mandatory */
        if (deviation->deviate[i].flags & LYS_MAND_TRUE) {
            yin_print_substmt(out, level, LYEXT_SUBSTMT_MANDATORY, 0, "true", module,
                              deviation->deviate[i].ext, deviation->deviate[i].ext_size);
        } else if (deviation->deviate[i].flags & LYS_MAND_FALSE) {
            yin_print_substmt(out, level, LYEXT_SUBSTMT_MANDATORY, 0, "false", module,
                              deviation->deviate[i].ext, deviation->deviate[i].ext_size);
        }

        /* min-elements */
        if (deviation->deviate[i].min_set) {
            yin_print_unsigned(out, level, LYEXT_SUBSTMT_MIN, 0, module,
                               deviation->deviate[i].ext, deviation->deviate[i].ext_size,
                               deviation->deviate[i].min);
        }

        /* max-elements */
        if (deviation->deviate[i].max_set) {
            if (deviation->deviate[i].max) {
                yin_print_unsigned(out, level, LYEXT_SUBSTMT_MAX, 0, module,
                                   deviation->deviate[i].ext, deviation->deviate[i].ext_size,
                                   deviation->deviate[i].max);
            } else {
                yin_print_substmt(out, level, LYEXT_SUBSTMT_MAX, 0, "unbounded", module,
                                  deviation->deviate[i].ext, deviation->deviate[i].ext_size);
            }
        }
        level--;

        yin_print_close(out, level, NULL, "deviate", 1);
    }

    level--;
    yin_print_close(out, level, NULL, "deviation", 1);
}